

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O2

int Wlc_NtkAbsCore2(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  uint uVar1;
  Abc_Cex_t *pCex;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  abctime aVar9;
  Vec_Bit_t *p_00;
  Vec_Int_t *pVVar10;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar11;
  Vec_Bit_t *p_02;
  Wlc_Obj_t *pWVar12;
  ulong uVar13;
  Wlc_Obj_t *pWVar14;
  Wlc_Ntk_t *p_03;
  Gia_Man_t *pGVar15;
  Gia_Man_t *p_04;
  Aig_Man_t *pAig;
  Abc_Cex_t *p_05;
  abctime aVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  Wlc_Obj_t *pWVar20;
  int nCapMin;
  Wlc_Obj_t *pWVar21;
  char *__format;
  long lVar22;
  bool bVar23;
  int local_13c;
  Pdr_Par_t PdrPars;
  
  aVar9 = Abc_Clock();
  p_00 = Vec_BitStart(p->iObj);
  Pdr_ManSetDefaultParams(&PdrPars);
  PdrPars.fUseAbs = 1;
  PdrPars.fSkipDown = 0;
  PdrPars.fCtgs = 1;
  PdrPars.fVerbose = pPars->fPdrVerbose;
  pWVar21 = (Wlc_Obj_t *)0x1;
  local_13c = -1;
  do {
    if (pPars->nIterMax <= (int)pWVar21) {
LAB_006d920e:
      Vec_BitFree(p_00);
      if (pPars->fVerbose != 0) {
        putchar(10);
      }
      printf("Abstraction ");
      pcVar17 = "timed out";
      if (local_13c == 1) {
        pcVar17 = "is successfully proved";
      }
      __format = "resulted in a real CEX";
      if (local_13c != 0) {
        __format = pcVar17;
      }
      printf(__format);
      iVar19 = 0x76628f;
      printf(" after %d iterations. ",pWVar21);
      aVar16 = Abc_Clock();
      Abc_Print(iVar19,"%s =","Time");
      Abc_Print(iVar19,"%9.2f sec\n",(double)(aVar16 - aVar9) / 1000000.0);
      return local_13c;
    }
    pWVar14 = pWVar21;
    if (pPars->fVerbose == 0) {
      bVar23 = true;
    }
    else {
      printf("\nIteration %d:\n");
      bVar23 = pPars->fVerbose == 0;
    }
    pVVar10 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    pVVar11 = Vec_IntAlloc(100);
    p_02 = Vec_BitStart(p->iObj);
    uVar8 = 0;
    uVar7 = 0;
    uVar1 = 0;
    pWVar20 = (Wlc_Obj_t *)0x1;
    while (iVar19 = (int)pWVar20, iVar19 < p->iObj) {
      pWVar14 = pWVar20;
      pWVar12 = Wlc_NtkObj(p,iVar19);
      if ((p_00 == (Vec_Bit_t *)0x0) ||
         (iVar3 = Vec_BitEntry(p_00,iVar19), pWVar14 = pWVar20, iVar3 == 0)) {
        uVar4 = *(ushort *)pWVar12 & 0x3f;
        if (uVar4 < 0x33) {
          if ((0x1e00000000000U >> uVar4 & 1) == 0) {
            if ((0x4180000000000U >> uVar4 & 1) == 0) {
              if (uVar4 != 8) goto LAB_006d8c92;
              iVar5 = pWVar12->End - pWVar12->Beg;
              iVar3 = -iVar5;
              if (0 < iVar5) {
                iVar3 = iVar5;
              }
              if (pPars->nBitsMux <= iVar3 + 1) {
                lVar22 = (long)pWVar12 - (long)p->pObjs;
                uVar13 = lVar22 / 0x18;
                pWVar14 = (Wlc_Obj_t *)(uVar13 & 0xffffffff);
                Vec_BitWriteEntry(p_02,(int)uVar13,(int)(lVar22 % 0x18));
                uVar1 = uVar1 + 1;
              }
            }
            else {
              iVar5 = pWVar12->End - pWVar12->Beg;
              iVar3 = -iVar5;
              if (0 < iVar5) {
                iVar3 = iVar5;
              }
              if (pPars->nBitsAdd <= iVar3 + 1) {
                lVar22 = (long)pWVar12 - (long)p->pObjs;
                uVar13 = lVar22 / 0x18;
                pWVar14 = (Wlc_Obj_t *)(uVar13 & 0xffffffff);
                Vec_BitWriteEntry(p_02,(int)uVar13,(int)(lVar22 % 0x18));
                uVar8 = uVar8 + 1;
              }
            }
          }
          else {
            iVar5 = pWVar12->End - pWVar12->Beg;
            iVar3 = -iVar5;
            if (0 < iVar5) {
              iVar3 = iVar5;
            }
            if (pPars->nBitsMul <= iVar3 + 1) {
              lVar22 = (long)pWVar12 - (long)p->pObjs;
              uVar13 = lVar22 / 0x18;
              pWVar14 = (Wlc_Obj_t *)(uVar13 & 0xffffffff);
              Vec_BitWriteEntry(p_02,(int)uVar13,(int)(lVar22 % 0x18));
              uVar7 = uVar7 + 1;
            }
          }
        }
        else {
LAB_006d8c92:
          if ((short)uVar4 != 1 && (*(ushort *)pWVar12 & 0x3d) == 1) {
            iVar5 = pWVar12->End - pWVar12->Beg;
            iVar3 = -iVar5;
            if (0 < iVar5) {
              iVar3 = iVar5;
            }
            if (pPars->nBitsFlop <= iVar3 + 1) {
              lVar22 = (long)pWVar12 - (long)p->pObjs;
              uVar13 = lVar22 / 0x18;
              pWVar14 = (Wlc_Obj_t *)(uVar13 & 0xffffffff);
              Vec_BitWriteEntry(p_02,(int)uVar13,(int)(lVar22 % 0x18));
            }
          }
        }
      }
      pWVar20 = (Wlc_Obj_t *)(ulong)(iVar19 + 1);
    }
    if (!bVar23) {
      pWVar14 = (Wlc_Obj_t *)(ulong)uVar8;
      printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
             ,pWVar14,(ulong)uVar7,(ulong)uVar1);
    }
    Wlc_NtkCleanMarks(p);
    for (iVar19 = 0; iVar19 < (p->vCos).nSize; iVar19 = iVar19 + 1) {
      pWVar14 = Wlc_NtkCo(p,iVar19);
      Wlc_NtkAbsMarkNodes_rec(p,pWVar14,p_02,pVVar10,p_01,pVVar11);
    }
    for (iVar19 = 0; iVar19 < pVVar11->nSize; iVar19 = iVar19 + 1) {
      iVar3 = Vec_IntEntry(pVVar11,iVar19);
      pWVar14 = Wlc_NtkObj(p,iVar3);
      pWVar14 = Wlc_ObjFo2Fi(p,pWVar14);
      Wlc_NtkAbsMarkNodes_rec(p,pWVar14,p_02,pVVar10,p_01,pVVar11);
    }
    pWVar20 = (Wlc_Obj_t *)0x1;
    while( true ) {
      iVar3 = (int)pWVar14;
      iVar19 = (int)pWVar20;
      if (p->iObj <= iVar19) break;
      pWVar14 = pWVar20;
      Wlc_NtkObj(p,iVar19);
      pWVar20 = (Wlc_Obj_t *)(ulong)(iVar19 + 1);
    }
    Vec_IntSort(pVVar10,iVar3);
    Vec_IntSort(p_01,iVar3);
    Vec_IntSort(pVVar11,iVar3);
    Wlc_NtkCleanMarks(p);
    Vec_BitFree(p_02);
    p_03 = Wlc_NtkDupDfsAbs(p,pVVar10,p_01,pVVar11);
    Vec_IntFree(pVVar10);
    Vec_IntFree(pVVar11);
    pGVar15 = Wlc_NtkBitBlast(p_03,(Wlc_BstPar_t *)0x0);
    iVar19 = Wlc_NtkDcFlopNum(p_03);
    p_04 = pGVar15;
    if (0 < iVar19) {
      iVar3 = Wlc_NtkCountObjBits(p,p_01);
      p_04 = Gia_ManPermuteInputs(pGVar15,iVar3,iVar19);
      Gia_ManStop(pGVar15);
    }
    pGVar15 = p_04;
    if (pPars->fXorOutput != 0) {
      pGVar15 = Gia_ManTransformMiter2(p_04);
      Gia_ManStop(p_04);
    }
    if (pPars->fVerbose != 0) {
      printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
             (ulong)(p_03->iObj - 1),(ulong)(uint)p_01->nSize);
      Gia_ManPrintStats(pGVar15,(Gps_Par_t *)0x0);
    }
    Wlc_NtkFree(p_03);
    pAig = Gia_ManToAigSimple(pGVar15);
    local_13c = Pdr_ManSolve(pAig,&PdrPars);
    pCex = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAig);
    if (pCex == (Abc_Cex_t *)0x0) {
      if (local_13c == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0x16d,"int Wlc_NtkAbsCore2(Wlc_Ntk_t *, Wlc_Par_t *)");
      }
      Gia_ManStop(pGVar15);
      Vec_IntFree(p_01);
      goto LAB_006d920e;
    }
    pVVar10 = Vec_IntAlloc(100);
    iVar19 = pCex->nPis;
    pVVar11 = Vec_IntAlloc(iVar19);
    pVVar11->nSize = iVar19;
    piVar2 = pVVar11->pArray;
    if (piVar2 != (int *)0x0) {
      memset(piVar2,0xff,(long)iVar19 << 2);
    }
    uVar13 = 0;
    for (iVar3 = 0; iVar5 = (int)uVar13, iVar3 < p_01->nSize; iVar3 = iVar3 + 1) {
      iVar6 = Vec_IntEntry(p_01,iVar3);
      pWVar14 = Wlc_NtkObj(p,iVar6);
      lVar22 = 0;
      while( true ) {
        uVar7 = pWVar14->End - pWVar14->Beg;
        uVar8 = -uVar7;
        if (0 < (int)uVar7) {
          uVar8 = uVar7;
        }
        uVar7 = (uint)lVar22;
        if (uVar8 < uVar7) break;
        if ((iVar5 < 0) || (iVar19 <= (int)(iVar5 + uVar7))) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar2[uVar13 + lVar22] = (int)(((long)pWVar14 - (long)p->pObjs) / 0x18);
        lVar22 = lVar22 + 1;
      }
      uVar13 = (ulong)(iVar5 + uVar7);
    }
    iVar5 = pCex->nPis - iVar5;
    p_05 = Bmc_CexCareMinimizeAig(pGVar15,iVar5,pCex,1,0,0);
    iVar19 = p_05->nPis;
    if (iVar19 != pCex->nPis) {
      __assert_fail("pCexCare->nPis == pCex->nPis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                    ,0xcf,
                    "Vec_Int_t *Wlc_NtkAbsRefinement(Wlc_Ntk_t *, Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *)"
                   );
    }
    for (iVar3 = 0; iVar6 = iVar5, iVar3 <= p_05->iFrame; iVar3 = iVar3 + 1) {
      for (; iVar6 < iVar19; iVar6 = iVar6 + 1) {
        uVar8 = iVar19 * iVar3 + iVar6 + p_05->nRegs;
        if (((uint)(&p_05[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
          iVar19 = Vec_IntEntry(pVVar11,iVar6 - iVar5);
          uVar8 = pVVar10->nSize;
          uVar13 = 0;
          if (0 < (int)uVar8) {
            uVar13 = (ulong)uVar8;
          }
          uVar18 = 0;
LAB_006d9024:
          if (uVar13 != uVar18) goto code_r0x006d9029;
          if (uVar8 == pVVar10->nCap) {
            nCapMin = uVar8 * 2;
            if ((int)uVar8 < 0x10) {
              nCapMin = 0x10;
            }
            Vec_IntGrow(pVVar10,nCapMin);
            uVar8 = pVVar10->nSize;
          }
          pVVar10->nSize = uVar8 + 1;
          piVar2 = pVVar10->pArray;
          for (uVar13 = (ulong)uVar8;
              (uVar7 = (int)uVar8 >> 0x1f & uVar8, 0 < (int)(uint)uVar13 &&
              (uVar7 = (uint)uVar13, iVar19 < piVar2[uVar13 - 1])); uVar13 = uVar13 - 1) {
            piVar2[uVar13] = piVar2[uVar13 - 1];
          }
          piVar2[(int)uVar7] = iVar19;
        }
LAB_006d908c:
        iVar19 = p_05->nPis;
      }
    }
    Abc_CexFree(p_05);
    Vec_IntFree(pVVar11);
    if (pVVar10->nSize == 0) {
      free(pVVar10->pArray);
      free(pVVar10);
      pVVar10 = (Vec_Int_t *)0x0;
    }
    Gia_ManStop(pGVar15);
    Vec_IntFree(p_01);
    if (pVVar10 == (Vec_Int_t *)0x0) {
      Abc_CexFree(pCex);
      goto LAB_006d920e;
    }
    if ((p->vRefs).nSize == 0) {
      Wlc_NtkSetRefs(p);
    }
    uVar8 = 0;
    for (iVar19 = 0; iVar19 < pVVar10->nSize; iVar19 = iVar19 + 1) {
      iVar3 = Vec_IntEntry(pVVar10,iVar19);
      for (pWVar14 = Wlc_NtkObj(p,iVar3);
          (undefined1  [24])((undefined1  [24])*pWVar14 & (undefined1  [24])0x3d) ==
          (undefined1  [24])0x1; pWVar14 = Wlc_ObjFo2Fi(p,pWVar14)) {
        lVar22 = (long)pWVar14 - (long)p->pObjs;
        Vec_BitWriteEntry(p_00,(int)(lVar22 / 0x18),(int)(lVar22 % 0x18));
      }
      iVar3 = Wlc_NtkNodeDeref_rec(p,pWVar14,p_00);
      iVar5 = Wlc_NtkNodeRef_rec(p,pWVar14);
      if (iVar3 != iVar5) {
        __assert_fail("Count1 == Count2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0x111,"int Wlc_NtkMarkMffc(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *)");
      }
      uVar8 = uVar8 + iVar3;
    }
    if (pPars->fVerbose != 0) {
      printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
             ,(ulong)(uint)pCex->iFrame,(ulong)(uint)pVVar10->nSize,(ulong)uVar8);
    }
    Vec_IntFree(pVVar10);
    Abc_CexFree(pCex);
    pWVar21 = (Wlc_Obj_t *)(ulong)((int)pWVar21 + 1);
  } while( true );
code_r0x006d9029:
  piVar2 = pVVar10->pArray + uVar18;
  uVar18 = uVar18 + 1;
  if (*piVar2 == iVar19) goto LAB_006d908c;
  goto LAB_006d9024;
}

Assistant:

int Wlc_NtkAbsCore2( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, pPars->fVerbose );
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}